

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeGZ2.cpp
# Opt level: O1

void writeGZ2(char *fileName,half *gPixels,float *zPixels,int width,int height,Box2i *dataWindow)

{
  int iVar1;
  Vec2<int> *pVVar2;
  char *pcVar3;
  OutputFile file;
  undefined8 local_d0 [7];
  FrameBuffer frameBuffer;
  Header header;
  
  local_d0[0] = 0;
  Imf_3_4::Header::Header((Header *)0x3f800000,0x3f800000,&header,width,height,local_d0,0,3);
  pVVar2 = (Vec2<int> *)Imf_3_4::Header::dataWindow();
  *pVVar2 = dataWindow->min;
  pVVar2[1] = dataWindow->max;
  pcVar3 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)local_d0,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar3,(Channel *)"G");
  pcVar3 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)local_d0,FLOAT,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar3,(Channel *)0x10a0fb);
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile(&file,fileName,&header,iVar1);
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_4::Slice::Slice
            ((Slice *)local_d0,HALF,(char *)gPixels,2,(long)width * 2,1,1,0.0,false,false);
  Imf_3_4::FrameBuffer::insert((char *)&frameBuffer,(Slice *)"G");
  Imf_3_4::Slice::Slice
            ((Slice *)local_d0,FLOAT,(char *)zPixels,4,(long)width << 2,1,1,0.0,false,false);
  Imf_3_4::FrameBuffer::insert((char *)&frameBuffer,(Slice *)0x10a0fb);
  Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&file);
  Imf_3_4::OutputFile::writePixels((int)&file);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)&frameBuffer);
  Imf_3_4::OutputFile::~OutputFile(&file);
  Imf_3_4::Header::~Header(&header);
  return;
}

Assistant:

void
writeGZ2 (
    const char   fileName[],
    const half*  gPixels,
    const float* zPixels,
    int          width,
    int          height,
    const Box2i& dataWindow)
{
    Header header (width, height);
    header.dataWindow () = dataWindow;
    header.channels ().insert ("G", Channel (HALF));
    header.channels ().insert ("Z", Channel (FLOAT));

    OutputFile file (fileName, header);

    FrameBuffer frameBuffer;

    frameBuffer.insert (
        "G", // name
        Slice (
            HALF,                        // type
            (char*) gPixels,             // base
            sizeof (*gPixels) * 1,       // xStride
            sizeof (*gPixels) * width)); // yStride

    frameBuffer.insert (
        "Z", // name
        Slice (
            FLOAT,                       // type
            (char*) zPixels,             // base
            sizeof (*zPixels) * 1,       // xStride
            sizeof (*zPixels) * width)); // yStride

    file.setFrameBuffer (frameBuffer);
    file.writePixels (dataWindow.max.y - dataWindow.min.y + 1);
}